

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typedisplay.cc
# Opt level: O0

bool __thiscall
Typelib::TypeDisplayVisitor::visit_(TypeDisplayVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  size_t sVar2;
  Type *local_20;
  Field *field_local;
  Compound *type_local;
  TypeDisplayVisitor *this_local;
  
  local_20 = (Type *)field;
  field_local = (Field *)type;
  type_local = (Compound *)this;
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,"(+");
  sVar2 = Field::getOffset((Field *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,") ");
  TypeVisitor::visit_(&this->super_TypeVisitor,(Compound *)field_local,(Field *)local_20);
  poVar1 = std::operator<<(this->m_stream," ");
  Field::getName_abi_cxx11_((Field *)&stack0xffffffffffffffc0);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffc0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return true;
}

Assistant:

bool TypeDisplayVisitor::visit_(Compound const& type, Field const& field)
{
    m_stream << m_indent << "(+" << field.getOffset() << ") ";
    TypeVisitor::visit_(type, field);
    m_stream << " " << field.getName() << std::endl;
    return true;
}